

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

void Vga_ManPrintCore(Vta_Man_t *p,Vec_Int_t *vCore,int Lift)

{
  uint uVar1;
  int i;
  Vta_Man_t *pVVar2;
  
  pVVar2 = p;
  for (i = 0; i < vCore->nSize; i = i + 1) {
    pVVar2 = (Vta_Man_t *)vCore;
    uVar1 = Vec_IntEntry(vCore,i);
    Abc_Print((int)pVVar2,"%d*%d ",(ulong)(p->nObjMask & uVar1),
              (ulong)(uint)(((int)uVar1 >> ((byte)p->nObjBits & 0x1f)) + Lift));
  }
  Abc_Print((int)pVVar2,"\n");
  return;
}

Assistant:

void Vga_ManPrintCore( Vta_Man_t * p, Vec_Int_t * vCore, int Lift )
{
    int i, Entry, iObj, iFrame;
    Vec_IntForEachEntry( vCore, Entry, i )
    {
        iObj   = (Entry &  p->nObjMask);
        iFrame = (Entry >> p->nObjBits);
        Abc_Print( 1, "%d*%d ", iObj, iFrame+Lift );
    }
    Abc_Print( 1, "\n" );
}